

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
glcts::UniformBlocksLayoutBindingCase::teardownTest(UniformBlocksLayoutBindingCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x40))(0x8a11,0);
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))
            (1,&(this->super_LayoutBindingBaseCase).field_0x224);
  return;
}

Assistant:

void teardownTest(void)
	{
		gl().bindBuffer(GL_UNIFORM_BUFFER, 0);
		gl().deleteBuffers(1, &m_buffername);
	}